

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

void __thiscall mau::PacketQueue::InsertSorted(PacketQueue *this,QueueNode *node)

{
  QueueNode *pQVar1;
  QueueNode *pQVar2;
  
  pQVar1 = this->Tail;
  if (pQVar1 == (QueueNode *)0x0) {
    this->Head = node;
    this->Tail = node;
    pQVar2 = (QueueNode *)0x0;
    pQVar1 = (QueueNode *)0x0;
  }
  else {
    if (node->DeliveryUsec < pQVar1->DeliveryUsec) {
      do {
        pQVar2 = pQVar1;
        pQVar1 = pQVar2->Prev;
        if (pQVar1 == (QueueNode *)0x0) {
          this->Head = node;
          pQVar2->Prev = node;
          pQVar1 = (QueueNode *)0x0;
          goto LAB_0018cbd2;
        }
      } while (node->DeliveryUsec < pQVar1->DeliveryUsec);
    }
    else {
      pQVar2 = (QueueNode *)0x0;
    }
    pQVar1->Next = node;
    if (pQVar2 == (QueueNode *)0x0) {
      this->Tail = node;
    }
    else {
      pQVar2->Prev = node;
    }
  }
LAB_0018cbd2:
  node->Next = pQVar2;
  node->Prev = pQVar1;
  return;
}

Assistant:

void PacketQueue::InsertSorted(QueueNode* node)
{
    const uint64_t deliveryUsec = node->DeliveryUsec;

    QueueNode* next = nullptr;

    // Insert at front or middle (based on target delivery time):
    for (QueueNode* prev = Tail; prev; next = prev, prev = prev->Prev)
    {
        // If we should insert after prev:
        if (deliveryUsec >= prev->DeliveryUsec)
        {
            if (prev) {
                prev->Next = node;
            }
            else {
                Head = node;
            }
            if (next) {
                next->Prev = node;
            }
            else {
                Tail = node;
            }
            node->Next = next;
            node->Prev = prev;

            return;
        }
    }

    // Insert at the front:
    Head = node;
    if (next) {
        next->Prev = node;
    }
    else {
        Tail = node;
    }
    node->Next = next;
    node->Prev = nullptr;
}